

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O1

void zmatvec(int ldm,int nrow,int ncol,doublecomplex *M,doublecomplex *vec,doublecomplex *Mxvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  double dVar17;
  double dVar18;
  
  uVar11 = 0;
  if (3 < ncol) {
    lVar15 = (long)ldm;
    lVar12 = (long)(ldm * 4);
    pdVar14 = &M[lVar15].i;
    pdVar16 = &M[lVar15 * 2].i;
    pdVar13 = &M[lVar15 * 3].i;
    uVar11 = 0;
    do {
      if (0 < nrow) {
        dVar1 = vec[uVar11].r;
        dVar2 = vec[uVar11].i;
        dVar3 = vec[uVar11 + 1].r;
        dVar4 = vec[uVar11 + 1].i;
        dVar5 = vec[uVar11 + 2].r;
        dVar6 = vec[uVar11 + 2].i;
        dVar7 = vec[uVar11 + 3].r;
        dVar8 = vec[uVar11 + 3].i;
        lVar15 = 0;
        do {
          dVar9 = *(double *)((long)&M->r + lVar15);
          dVar10 = *(double *)((long)&M->i + lVar15);
          dVar17 = dVar1 * dVar9 + dVar10 * -dVar2 + *(double *)((long)&Mxvec->r + lVar15);
          *(double *)((long)&Mxvec->r + lVar15) = dVar17;
          dVar18 = dVar9 * dVar2 + dVar10 * dVar1 + *(double *)((long)&Mxvec->i + lVar15);
          *(double *)((long)&Mxvec->i + lVar15) = dVar18;
          dVar9 = *(double *)((long)pdVar14 + lVar15 + -8);
          dVar10 = *(double *)((long)pdVar14 + lVar15);
          dVar17 = dVar3 * dVar9 + dVar10 * -dVar4 + dVar17;
          *(double *)((long)&Mxvec->r + lVar15) = dVar17;
          dVar18 = dVar9 * dVar4 + dVar10 * dVar3 + dVar18;
          *(double *)((long)&Mxvec->i + lVar15) = dVar18;
          dVar9 = *(double *)((long)pdVar16 + lVar15 + -8);
          dVar10 = *(double *)((long)pdVar16 + lVar15);
          dVar17 = dVar5 * dVar9 + dVar10 * -dVar6 + dVar17;
          *(double *)((long)&Mxvec->r + lVar15) = dVar17;
          dVar18 = dVar9 * dVar6 + dVar10 * dVar5 + dVar18;
          *(double *)((long)&Mxvec->i + lVar15) = dVar18;
          dVar9 = *(double *)((long)pdVar13 + lVar15 + -8);
          dVar10 = *(double *)((long)pdVar13 + lVar15);
          *(double *)((long)&Mxvec->r + lVar15) = dVar7 * dVar9 + dVar10 * -dVar8 + dVar17;
          *(double *)((long)&Mxvec->i + lVar15) = dVar9 * dVar8 + dVar10 * dVar7 + dVar18;
          lVar15 = lVar15 + 0x10;
        } while ((ulong)(uint)nrow << 4 != lVar15);
      }
      uVar11 = uVar11 + 4;
      M = M + lVar12;
      pdVar14 = pdVar14 + lVar12 * 2;
      pdVar16 = pdVar16 + lVar12 * 2;
      pdVar13 = pdVar13 + lVar12 * 2;
    } while ((long)uVar11 < (long)(ncol + -3));
  }
  if ((int)uVar11 < ncol) {
    uVar11 = uVar11 & 0xffffffff;
    do {
      if (0 < nrow) {
        dVar1 = vec[uVar11].r;
        dVar2 = vec[uVar11].i;
        lVar12 = 0;
        do {
          dVar3 = *(double *)((long)&M->r + lVar12);
          dVar4 = *(double *)((long)&M->i + lVar12);
          *(double *)((long)&Mxvec->r + lVar12) =
               dVar1 * dVar3 + dVar4 * -dVar2 + *(double *)((long)&Mxvec->r + lVar12);
          *(double *)((long)&Mxvec->i + lVar12) =
               dVar3 * dVar2 + dVar4 * dVar1 + *(double *)((long)&Mxvec->i + lVar12);
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(uint)nrow << 4 != lVar12);
      }
      uVar11 = uVar11 + 1;
      M = M + ldm;
    } while (uVar11 != (uint)ncol);
  }
  return;
}

Assistant:

void zmatvec (int ldm, int nrow, int ncol, doublecomplex *M, doublecomplex *vec, doublecomplex *Mxvec)
{
    doublecomplex vi0, vi1, vi2, vi3;
    doublecomplex *M0, temp;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;
    int k;

    M0 = &M[0];

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */
	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi1, Mki1); Mki1++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi2, Mki2); Mki2++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi3, Mki3); Mki3++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */
 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}
	M0 += ldm;
    }
	
}